

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallbackFederate.cpp
# Opt level: O0

void __thiscall
helics::CallbackFederate::CallbackFederate(CallbackFederate *this,string *configString)

{
  string_view fedName;
  string_view fedName_00;
  void **in_RDI;
  FederateInfo *in_stack_fffffffffffffc40;
  function<std::pair<TimeRepresentation<count_time<9,_long>_>,_helics::IterationRequest>_(helics::iteration_time)>
  *this_00;
  FederateInfo *in_stack_fffffffffffffc50;
  CombinationFederate *this_01;
  undefined1 *puVar1;
  char *in_stack_fffffffffffffc70;
  string *in_stack_fffffffffffffcc8;
  FederateInfo *in_stack_fffffffffffffcd8;
  Federate *in_stack_fffffffffffffce0;
  size_t in_stack_fffffffffffffce8;
  CallbackFederate *in_stack_fffffffffffffcf0;
  basic_string_view<char,_std::char_traits<char>_> local_1e8 [2];
  undefined1 local_1c8 [424];
  basic_string_view<char,_std::char_traits<char>_> local_20 [2];
  
  this_01 = (CombinationFederate *)(in_RDI + 0x13);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_20);
  puVar1 = local_1c8;
  loadFederateInfo(in_stack_fffffffffffffcc8);
  fedName_00._M_str = (char *)in_stack_fffffffffffffcf0;
  fedName_00._M_len = in_stack_fffffffffffffce8;
  Federate::Federate(in_stack_fffffffffffffce0,fedName_00,in_stack_fffffffffffffcd8);
  FederateInfo::~FederateInfo(in_stack_fffffffffffffc40);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_1e8);
  loadFederateInfo(in_stack_fffffffffffffcc8);
  fedName._M_str = in_stack_fffffffffffffc70;
  fedName._M_len = (size_t)puVar1;
  helics::CombinationFederate::CombinationFederate(this_01,in_RDI,fedName,in_stack_fffffffffffffc50)
  ;
  FederateInfo::~FederateInfo(in_stack_fffffffffffffc40);
  *in_RDI = vtable + 0x18;
  in_RDI[0x13] = vtable + 0x140;
  in_RDI[2] = vtable + 0x78;
  std::shared_ptr<helics::CallbackFederateOperator>::shared_ptr
            ((shared_ptr<helics::CallbackFederateOperator> *)0x3bdc27);
  *(undefined1 *)(in_RDI + 6) = 0;
  this_00 = (function<std::pair<TimeRepresentation<count_time<9,_long>_>,_helics::IterationRequest>_(helics::iteration_time)>
             *)(in_RDI + 7);
  std::function<helics::IterationRequest_()>::function
            ((function<helics::IterationRequest_()> *)this_00);
  std::
  function<std::pair<TimeRepresentation<count_time<9,_long>_>,_helics::IterationRequest>_(helics::iteration_time)>
  ::function(this_00);
  std::function<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>)>
  ::function((function<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>)>
              *)this_00);
  loadOperator(in_stack_fffffffffffffcf0);
  return;
}

Assistant:

CallbackFederate::CallbackFederate(const std::string& configString):
    Federate(std::string_view{}, loadFederateInfo(configString)),
    CombinationFederate(std::string_view{}, loadFederateInfo(configString))
{
    loadOperator();
}